

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O3

int x509_name_canon(X509_NAME *a)

{
  uchar **out;
  ASN1_STRING *dst;
  ASN1_STRING *str;
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  OPENSSL_STACK *sk;
  undefined8 *puVar5;
  size_t sVar6;
  ASN1_VALUE *val;
  ASN1_OBJECT *pAVar7;
  ulong uVar8;
  int iVar9;
  byte *pbVar10;
  uchar *puVar11;
  byte *pbVar12;
  uchar *p;
  int local_6c;
  OPENSSL_STACK *local_58;
  uchar *local_38;
  
  if (a->canon_enc != (uchar *)0x0) {
    OPENSSL_free(a->canon_enc);
    a->canon_enc = (uchar *)0x0;
  }
  sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
  if (sVar4 == 0) {
    a->canon_enclen = 0;
    iVar9 = 1;
  }
  else {
    sk = OPENSSL_sk_new_null();
    if (sk == (OPENSSL_STACK *)0x0) {
      iVar9 = 0;
    }
    else {
      sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
      if (sVar4 != 0) {
        local_6c = -1;
        sVar4 = 0;
        local_58 = (OPENSSL_STACK *)0x0;
        do {
          puVar5 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)a->entries,sVar4);
          if (*(int *)(puVar5 + 2) != local_6c) {
            local_58 = OPENSSL_sk_new_null();
            iVar9 = 0;
            if (local_58 == (OPENSSL_STACK *)0x0) goto LAB_0049aa38;
            sVar6 = OPENSSL_sk_push(sk,local_58);
            if (sVar6 == 0) {
              OPENSSL_sk_free(local_58);
              iVar9 = 0;
              goto LAB_0049aa38;
            }
            local_6c = *(int *)(puVar5 + 2);
          }
          val = ASN1_item_new((ASN1_ITEM *)&X509_NAME_ENTRY_it);
          iVar9 = 0;
          if (val == (ASN1_VALUE *)0x0) goto LAB_0049aa38;
          pAVar7 = OBJ_dup((ASN1_OBJECT *)*puVar5);
          *(ASN1_OBJECT **)val = pAVar7;
          dst = *(ASN1_STRING **)(val + 8);
          str = (ASN1_STRING *)puVar5[1];
          uVar8 = ASN1_tag2bit(str->type);
          if ((uVar8 & 0x2956) == 0) {
            iVar9 = ASN1_STRING_copy(dst,str);
            if (iVar9 != 0) goto LAB_0049a941;
LAB_0049aa1a:
            ASN1_item_free(val,(ASN1_ITEM *)&X509_NAME_ENTRY_it);
            iVar9 = 0;
            goto LAB_0049aa38;
          }
          dst->type = 0xc;
          out = &dst->data;
          uVar1 = ASN1_STRING_to_UTF8(out,str);
          dst->length = uVar1;
          if (uVar1 == 0xffffffff) goto LAB_0049aa1a;
          if (0 < (int)uVar1) {
            pbVar10 = *out;
            iVar9 = uVar1 + 1;
            uVar8 = (ulong)uVar1;
            pbVar12 = pbVar10;
            do {
              iVar2 = OPENSSL_isspace((uint)*pbVar12);
              if (iVar2 == 0) {
                pbVar10 = pbVar10 + uVar1;
                goto LAB_0049a90c;
              }
              pbVar12 = pbVar12 + 1;
              uVar8 = uVar8 - 1;
              iVar9 = iVar9 + -1;
            } while (1 < iVar9);
          }
LAB_0049a926:
          puVar11 = *out;
          iVar9 = (int)puVar11;
LAB_0049a931:
          dst->length = (int)puVar11 - iVar9;
LAB_0049a941:
          sVar6 = OPENSSL_sk_push(local_58,val);
          if (sVar6 == 0) goto LAB_0049aa1a;
          sVar4 = sVar4 + 1;
          sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)a->entries);
        } while (sVar4 < sVar6);
      }
      uVar1 = i2d_name_canon((stack_st_STACK_OF_X509_NAME_ENTRY *)sk,(uchar **)0x0);
      iVar9 = 0;
      if (-1 < (int)uVar1) {
        a->canon_enclen = uVar1;
        local_38 = (uchar *)OPENSSL_malloc((ulong)uVar1);
        if (local_38 != (uchar *)0x0) {
          a->canon_enc = local_38;
          i2d_name_canon((stack_st_STACK_OF_X509_NAME_ENTRY *)sk,&local_38);
          iVar9 = 1;
        }
      }
LAB_0049aa38:
      OPENSSL_sk_pop_free_ex
                (sk,sk_STACK_OF_X509_NAME_ENTRY_call_free_func,local_sk_X509_NAME_ENTRY_pop_free);
    }
  }
  return iVar9;
LAB_0049a90c:
  pbVar10 = pbVar10 + -1;
  iVar9 = OPENSSL_isspace((uint)*pbVar10);
  iVar2 = (int)uVar8;
  if (iVar9 != 0) goto code_r0x0049a919;
  puVar11 = *out;
  iVar9 = 0;
  do {
    iVar3 = OPENSSL_isspace((uint)*pbVar12);
    if (iVar3 == 0) {
      iVar3 = OPENSSL_tolower((uint)*pbVar12);
      *puVar11 = (uchar)iVar3;
      pbVar12 = pbVar12 + 1;
      iVar9 = iVar9 + 1;
    }
    else {
      *puVar11 = ' ';
      do {
        iVar9 = iVar9 + 1;
        pbVar10 = pbVar12 + 1;
        pbVar12 = pbVar12 + 1;
        iVar3 = OPENSSL_isspace((uint)*pbVar10);
      } while (iVar3 != 0);
    }
    puVar11 = puVar11 + 1;
  } while (iVar9 < iVar2);
  iVar9 = (int)*out;
  goto LAB_0049a931;
code_r0x0049a919:
  uVar8 = (ulong)(iVar2 - 1);
  if (iVar2 < 2) goto LAB_0049a926;
  goto LAB_0049a90c;
}

Assistant:

static int x509_name_canon(X509_NAME *a) {
  unsigned char *p;
  STACK_OF(STACK_OF_X509_NAME_ENTRY) *intname = NULL;
  STACK_OF(X509_NAME_ENTRY) *entries = NULL;
  X509_NAME_ENTRY *entry, *tmpentry = NULL;
  int set = -1, ret = 0, len;
  size_t i;

  if (a->canon_enc) {
    OPENSSL_free(a->canon_enc);
    a->canon_enc = NULL;
  }
  // Special case: empty X509_NAME => null encoding
  if (sk_X509_NAME_ENTRY_num(a->entries) == 0) {
    a->canon_enclen = 0;
    return 1;
  }
  intname = sk_STACK_OF_X509_NAME_ENTRY_new_null();
  if (!intname) {
    goto err;
  }
  for (i = 0; i < sk_X509_NAME_ENTRY_num(a->entries); i++) {
    entry = sk_X509_NAME_ENTRY_value(a->entries, i);
    if (entry->set != set) {
      entries = sk_X509_NAME_ENTRY_new_null();
      if (!entries) {
        goto err;
      }
      if (!sk_STACK_OF_X509_NAME_ENTRY_push(intname, entries)) {
        sk_X509_NAME_ENTRY_free(entries);
        goto err;
      }
      set = entry->set;
    }
    tmpentry = X509_NAME_ENTRY_new();
    if (tmpentry == NULL) {
      goto err;
    }
    tmpentry->object = OBJ_dup(entry->object);
    if (!asn1_string_canon(tmpentry->value, entry->value)) {
      goto err;
    }
    if (!sk_X509_NAME_ENTRY_push(entries, tmpentry)) {
      goto err;
    }
    tmpentry = NULL;
  }

  // Finally generate encoding

  len = i2d_name_canon(intname, NULL);
  if (len < 0) {
    goto err;
  }
  a->canon_enclen = len;

  p = reinterpret_cast<uint8_t *>(OPENSSL_malloc(a->canon_enclen));

  if (!p) {
    goto err;
  }

  a->canon_enc = p;

  i2d_name_canon(intname, &p);

  ret = 1;

err:

  if (tmpentry) {
    X509_NAME_ENTRY_free(tmpentry);
  }
  if (intname) {
    sk_STACK_OF_X509_NAME_ENTRY_pop_free(intname,
                                         local_sk_X509_NAME_ENTRY_pop_free);
  }
  return ret;
}